

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlParserCtxtPtr
xmlCreateIOParserCtxt
          (xmlSAXHandlerPtr sax,void *user_data,xmlInputReadCallback ioread,
          xmlInputCloseCallback ioclose,void *ioctx,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr in;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  
  if (ioread != (xmlInputReadCallback)0x0) {
    in = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,enc);
    if (in == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
    }
    else {
      ctxt = xmlNewSAXParserCtxt(sax,user_data);
      if (ctxt == (xmlParserCtxtPtr)0x0) {
        xmlFreeParserInputBuffer(in);
      }
      else {
        value = xmlNewIOInputStream(ctxt,in,enc);
        if (value != (xmlParserInputPtr)0x0) {
          inputPush(ctxt,value);
          return ctxt;
        }
        xmlFreeParserCtxt(ctxt);
      }
    }
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

xmlParserCtxtPtr
xmlCreateIOParserCtxt(xmlSAXHandlerPtr sax, void *user_data,
	xmlInputReadCallback   ioread, xmlInputCloseCallback  ioclose,
	void *ioctx, xmlCharEncoding enc) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;

    if (ioread == NULL) return(NULL);

    buf = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx, enc);
    if (buf == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL) {
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }

    inputStream = xmlNewIOInputStream(ctxt, buf, enc);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    inputPush(ctxt, inputStream);

    return(ctxt);
}